

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::make_subtrie(parameter_trie *this,char c)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 uVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  parameter_trie *p;
  _Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  _Var6;
  _Base_ptr p_Var7;
  char in_DL;
  sp_counted_base *extraout_RDX;
  shared_count sVar8;
  undefined7 in_register_00000031;
  _Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_bool>
  pVar9;
  parameter_trie_ptr pVar10;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_58;
  pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_> local_48;
  
  this_00 = (_Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
             *)CONCAT71(in_register_00000031,c);
  p_Var1 = (_Base_ptr)(this_00 + 8);
  p_Var7 = p_Var1;
  for (p_Var4 = *(_Base_ptr *)(this_00 + 0x10); p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[(char)uVar3 < in_DL]) {
    uVar3 = (undefined1)p_Var4[1]._M_color;
    if (in_DL <= (char)uVar3) {
      p_Var7 = p_Var4;
    }
  }
  _Var6._M_node = p_Var1;
  if ((p_Var7 != p_Var1) && (_Var6._M_node = p_Var7, in_DL < (char)p_Var7[1]._M_color)) {
    _Var6._M_node = p_Var1;
  }
  sVar8.pi_ = (sp_counted_base *)0x0;
  if (_Var6._M_node == p_Var1) {
    p = (parameter_trie *)operator_new(0x60);
    p_Var2 = &(p->m_subtrie)._M_t._M_impl.super__Rb_tree_header;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (p->m_id_candidates).
    super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (p->m_id_candidates).
    super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (p->m_id_candidates).
    super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (p->m_param_candidate).px = (element_type *)0x0;
    (p->m_param_candidate).pn.pi_ = (sp_counted_base *)0x0;
    p->m_has_final_candidate = false;
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>(&local_58,p);
    local_48.second.px = local_58.px;
    local_48.second.pn.pi_ = local_58.pn.pi_;
    local_58.px = (element_type *)0x0;
    local_58.pn.pi_ = (sp_counted_base *)0x0;
    pVar9 = std::
            _Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
            ::
            _M_emplace_unique<std::pair<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>
                      (this_00,&local_48);
    _Var6 = pVar9.first._M_node;
    detail::shared_count::~shared_count(&local_48.second.pn);
    detail::shared_count::~shared_count(&local_58.pn);
    sVar8.pi_ = extraout_RDX;
  }
  *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl = _Var6._M_node[1]._M_parent;
  p_Var5 = _Var6._M_node[1]._M_left;
  *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var5;
  if (p_Var5 != (_Base_ptr)0x0) {
    LOCK();
    *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
    UNLOCK();
  }
  pVar10.pn.pi_ = sVar8.pi_;
  pVar10.px = this;
  return pVar10;
}

Assistant:

parameter_trie_ptr  make_subtrie( char c )
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        if( it == m_subtrie.end() )
            it = m_subtrie.insert( std::make_pair( c, parameter_trie_ptr( new parameter_trie ) ) ).first;

        return it->second;
    }